

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O3

ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>
testing::ValuesIn<(anonymous_namespace)::nonUniformTileConfigParam,6ul>
          (anon_struct_524_5_7b11162c_for__M_head_impl (*array) [6])

{
  anon_struct_524_5_7b11162c_for__M_head_impl *__cur;
  _func_int **pp_Var1;
  _func_int *__dest;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam> PVar2;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  *pp_Var1 = (_func_int *)&PTR__ValuesInIteratorRangeGenerator_010164c0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  __dest = (_func_int *)operator_new(0xc48);
  pp_Var1[1] = __dest;
  pp_Var1[3] = __dest + 0xc48;
  memcpy(__dest,::(anonymous_namespace)::nonUniformTileConfigParams,0xc48);
  pp_Var1[2] = __dest + 0xc48;
  *(_func_int ***)*array = pp_Var1;
  ((anon_struct_524_5_7b11162c_for__M_head_impl *)((long)array + 0))->tile_widths[0] = 0;
  ((anon_struct_524_5_7b11162c_for__M_head_impl *)((long)array + 0))->tile_widths[1] = 0;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(0x18);
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr[1]._vptr_ParamGeneratorInterface = (_func_int **)0x100000001;
  (PVar2.impl_.
   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr)->_vptr_ParamGeneratorInterface = (_func_int **)&PTR___Sp_counted_base_01016588;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr[2]._vptr_ParamGeneratorInterface = pp_Var1;
  *(element_type **)(*array)[0].tile_widths =
       PVar2.impl_.
       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  return (ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}